

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O1

int __thiscall gl4cts::GPUShaderFP64Test3::programInfo::init(programInfo *this,EVP_PKEY_CTX *ctx)

{
  char *__s;
  iterator iVar1;
  undefined *puVar2;
  GLuint GVar3;
  deUint32 dVar4;
  uint err;
  long lVar5;
  size_t sVar6;
  undefined1 *extraout_RAX;
  undefined1 *puVar7;
  TestError *pTVar8;
  GLchar *in_RCX;
  long *in_RDX;
  char *__to;
  EVP_PKEY_CTX *ctx_00;
  programInfo *this_00;
  GLchar *in_R8;
  GLchar *in_R9;
  undefined1 *puVar9;
  GLint offset;
  GLchar *in_stack_00000008;
  GLchar *in_stack_00000010;
  string uniform_name_str;
  GLchar *uniform_name;
  stringstream uniform_name_stream;
  int local_224;
  int local_220;
  int local_21c;
  vector<int,std::allocator<int>> *local_218;
  GLchar *local_210;
  undefined1 *local_208;
  undefined8 local_200;
  undefined1 local_1f8;
  undefined7 uStack_1f7;
  undefined1 *local_1e8;
  vector<int,std::allocator<int>> *local_1e0;
  long *local_1d8 [2];
  long local_1c8 [2];
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  ctx_00 = *(EVP_PKEY_CTX **)(ctx + 8);
  local_218 = (vector<int,std::allocator<int>> *)in_RDX;
  local_210 = in_R9;
  lVar5 = (**(code **)(*(long *)ctx_00 + 0x18))();
  if (init(deqp::Context&,std::vector<gl4cts::GPUShaderFP64Test3::uniformDetails,std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>>,char_const*,char_const*,char_const*,char_const*,char_const*)
      ::varying_names == '\0') {
    init(ctx_00);
  }
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b30);
  this->m_fragment_shader_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8dd9);
  this->m_geometry_shader_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8e88);
  this->m_tesselation_control_shader_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8e87);
  this->m_tesselation_evaluation_shader_id = GVar3;
  GVar3 = (**(code **)(lVar5 + 0x3f0))(0x8b31);
  this->m_vertex_shader_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"CreateShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x1326);
  GVar3 = (**(code **)(lVar5 + 0x3c8))();
  this->m_program_object_id = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"CreateProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132a);
  (**(code **)(lVar5 + 0x14c8))(this->m_program_object_id,4,init::varying_names,0x8c8c);
  err = (**(code **)(lVar5 + 0x800))();
  this_00 = (programInfo *)(ulong)err;
  glu::checkError(err,"TransformFeedbackVaryings",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x132e);
  compile(this_00,(Context *)ctx,this->m_fragment_shader_id,in_RCX);
  compile(this_00,(Context *)ctx,this->m_geometry_shader_id,in_R8);
  compile(this_00,(Context *)ctx,this->m_tesselation_control_shader_id,local_210);
  compile(this_00,(Context *)ctx,this->m_tesselation_evaluation_shader_id,in_stack_00000008);
  compile(this_00,(Context *)ctx,this->m_vertex_shader_id,in_stack_00000010);
  link(this,(char *)ctx,__to);
  GVar3 = (**(code **)(lVar5 + 0xb38))(this->m_program_object_id,m_uniform_block_name);
  this->m_uniform_block_index = GVar3;
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetUniformBlockIndex",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0x133d);
  if (this->m_uniform_block_index == 0xffffffff) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Unifom block is inactive",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x1341);
  }
  else {
    (**(code **)(lVar5 + 0x760))
              (this->m_program_object_id,this->m_uniform_block_index,0x8a40,&this->m_buffer_size);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"GetActiveUniformBlockiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                    ,0x1346);
    if (this->m_buffer_size != 0) {
      puVar9 = *(undefined1 **)local_218;
      puVar7 = *(undefined1 **)((long)local_218 + 8);
      if (puVar7 != puVar9) {
        local_218 = (vector<int,std::allocator<int>> *)&this->m_uniform_offsets;
        local_1e0 = (vector<int,std::allocator<int>> *)&this->m_uniform_matrix_strides;
        local_210 = puVar7;
        do {
          local_1e8 = (undefined1 *)0x0;
          local_208 = &local_1f8;
          local_200 = 0;
          local_1f8 = 0;
          std::__cxx11::stringstream::stringstream(local_1b8);
          puVar2 = m_uniform_block_name;
          local_220 = 0;
          local_224 = 0;
          local_21c = 0;
          if (m_uniform_block_name == (undefined *)0x0) {
            std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
          }
          else {
            sVar6 = strlen(m_uniform_block_name);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,puVar2,sVar6);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,".",1);
          __s = *(char **)(puVar9 + 8);
          if (__s == (char *)0x0) {
            std::ios::clear((int)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
          }
          else {
            sVar6 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,__s,sVar6);
          }
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)&local_208,(string *)local_1d8);
          if (local_1d8[0] != local_1c8) {
            operator_delete(local_1d8[0],local_1c8[0] + 1);
          }
          local_1e8 = local_208;
          (**(code **)(lVar5 + 0xb40))(this->m_program_object_id,1,&local_1e8,&local_220);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"GetUniformIndices",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1360);
          if (local_220 == -1) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Unifom is inactive",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x1364);
LAB_0093b2c0:
            __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          (**(code **)(lVar5 + 0x770))(this->m_program_object_id,1,&local_220,0x8a3b,&local_224);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"GetActiveUniformsiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1369);
          if (local_224 == -1) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Unifom has invalid offset",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x136d);
            goto LAB_0093b2c0;
          }
          iVar1._M_current =
               (this->m_uniform_offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->m_uniform_offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_218,iVar1,&local_224);
          }
          else {
            *iVar1._M_current = local_224;
            (this->m_uniform_offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          (**(code **)(lVar5 + 0x770))(this->m_program_object_id,1,&local_220,0x8a3d,&local_21c);
          dVar4 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar4,"GetActiveUniformsiv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                          ,0x1374);
          if (local_224 == -1) {
            pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar8,"Unifom has invalid matrix stride",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                       ,0x1378);
            goto LAB_0093b2c0;
          }
          iVar1._M_current =
               (this->m_uniform_matrix_strides).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar1._M_current ==
              (this->m_uniform_matrix_strides).super__Vector_base<int,_std::allocator<int>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (local_1e0,iVar1,&local_21c);
          }
          else {
            *iVar1._M_current = local_21c;
            (this->m_uniform_matrix_strides).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          std::__cxx11::stringstream::~stringstream(local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          puVar7 = &local_1f8;
          if (local_208 != puVar7) {
            operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
            puVar7 = extraout_RAX;
          }
          puVar9 = puVar9 + 0x20;
        } while (puVar9 != local_210);
      }
      return (int)puVar7;
    }
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Unifom block size is 0",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
               ,0x134a);
  }
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GPUShaderFP64Test3::programInfo::init(deqp::Context& context, const std::vector<uniformDetails> uniform_details,
										   const glw::GLchar* fragment_shader_code,
										   const glw::GLchar* geometry_shader_code,
										   const glw::GLchar* tesselation_control_shader_code,
										   const glw::GLchar* tesselation_evaluation_shader_code,
										   const glw::GLchar* vertex_shader_code)
{
	/* GL entry points */
	const glw::Functions& gl = context.getRenderContext().getFunctions();

	/* Names of varyings to be captured with transform feedback */
	static const glw::GLchar* varying_names[] = { m_varying_name_gs_fs_gs_result, m_varying_name_gs_fs_tcs_result,
												  m_varying_name_gs_fs_tes_result, m_varying_name_gs_fs_vs_result };
	static const glw::GLuint n_varying_names = sizeof(varying_names) / sizeof(varying_names[0]);

	/* Create shader objects */
	m_fragment_shader_id			   = gl.createShader(GL_FRAGMENT_SHADER);
	m_geometry_shader_id			   = gl.createShader(GL_GEOMETRY_SHADER);
	m_tesselation_control_shader_id	= gl.createShader(GL_TESS_CONTROL_SHADER);
	m_tesselation_evaluation_shader_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	m_vertex_shader_id				   = gl.createShader(GL_VERTEX_SHADER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateShader");

	/* Create program object */
	m_program_object_id = gl.createProgram();
	GLU_EXPECT_NO_ERROR(gl.getError(), "CreateProgram");

	/* Set up names of varyings to be captured with transform feedback */
	gl.transformFeedbackVaryings(m_program_object_id, n_varying_names, varying_names, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "TransformFeedbackVaryings");

	/* Compile shaders */
	compile(context, m_fragment_shader_id, fragment_shader_code);
	compile(context, m_geometry_shader_id, geometry_shader_code);
	compile(context, m_tesselation_control_shader_id, tesselation_control_shader_code);
	compile(context, m_tesselation_evaluation_shader_id, tesselation_evaluation_shader_code);
	compile(context, m_vertex_shader_id, vertex_shader_code);

	/* Link program */
	link(context);

	/* Inspect program object */
	/* Get index of named uniform block */
	m_uniform_block_index = gl.getUniformBlockIndex(m_program_object_id, m_uniform_block_name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformBlockIndex");

	if (GL_INVALID_INDEX == m_uniform_block_index)
	{
		TCU_FAIL("Unifom block is inactive");
	}

	/* Get size of named uniform block */
	gl.getActiveUniformBlockiv(m_program_object_id, m_uniform_block_index, GL_UNIFORM_BLOCK_DATA_SIZE, &m_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformBlockiv");

	if (0 == m_buffer_size)
	{
		TCU_FAIL("Unifom block size is 0");
	}

	/* Get information about "double precision" uniforms */
	for (std::vector<uniformDetails>::const_iterator it = uniform_details.begin(), end = uniform_details.end();
		 end != it; ++it)
	{
		const glw::GLchar* uniform_name = 0;
		std::string		   uniform_name_str;
		std::stringstream  uniform_name_stream;
		glw::GLuint		   index		 = 0;
		glw::GLint		   offset		 = 0;
		glw::GLint		   matrix_stride = 0;

		/* Uniform name = UNIFORM_BLOCK_NAME.UNIFORM_NAME */
		uniform_name_stream << m_uniform_block_name << "." << it->m_name;

		uniform_name_str = uniform_name_stream.str();
		uniform_name	 = uniform_name_str.c_str();

		/* Get index of uniform */
		gl.getUniformIndices(m_program_object_id, 1 /* count */, &uniform_name, &index);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetUniformIndices");

		if (GL_INVALID_INDEX == index)
		{
			TCU_FAIL("Unifom is inactive");
		}

		/* Get offset of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_OFFSET, &offset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_offset == offset)
		{
			TCU_FAIL("Unifom has invalid offset");
		}

		m_uniform_offsets.push_back(offset);

		/* Get matrix stride of uniform */
		gl.getActiveUniformsiv(m_program_object_id, 1 /* count */, &index, GL_UNIFORM_MATRIX_STRIDE, &matrix_stride);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetActiveUniformsiv");

		if (m_invalid_uniform_matrix_stride == offset)
		{
			TCU_FAIL("Unifom has invalid matrix stride");
		}

		m_uniform_matrix_strides.push_back(matrix_stride);
	}
}